

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

QVariant * __thiscall
QLineEdit::inputMethodQuery
          (QVariant *__return_storage_ptr__,QLineEdit *this,InputMethodQuery property,
          QVariant argument)

{
  int iVar1;
  int iVar2;
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar3;
  int iVar4;
  int iVar5;
  QLineEditPrivate *d;
  long in_FS_OFFSET;
  bool bVar6;
  double dVar7;
  double in_XMM1_Qa;
  QRect QVar8;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  switch(property) {
  case ImEnabled:
    if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
      bVar6 = (this_00->control->field_0x50 & 4) == 0;
    }
    else {
      bVar6 = false;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
LAB_003ed0e0:
    ::QVariant::QVariant(__return_storage_ptr__,bVar6);
    break;
  case ImCursorRectangle:
    QVar8 = QLineEditPrivate::cursorRect(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
    ::QVariant::QVariant(__return_storage_ptr__,QVar8);
    break;
  case ImCursorRectangle|ImEnabled:
  case ImFont|ImEnabled:
  case ImFont|ImCursorRectangle:
  case ImFont|ImCursorRectangle|ImEnabled:
switchD_003ece63_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QWidget::inputMethodQuery(__return_storage_ptr__,&this->super_QWidget,property);
      return __return_storage_ptr__;
    }
    goto LAB_003ed168;
  case ImFont:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
    QFont::operator_cast_to_QVariant(__return_storage_ptr__,&((this->super_QWidget).data)->fnt);
    break;
  case ImCursorPosition:
switchD_003ece63_caseD_8:
    dVar7 = (double)::QVariant::toPointF();
    if (((dVar7 == 0.0) && (!NAN(dVar7))) && ((in_XMM1_Qa == 0.0 && (!NAN(in_XMM1_Qa))))) {
      iVar5 = this_00->control->m_cursor;
      goto LAB_003ed03b;
    }
    iVar4 = QLineEditPrivate::xToPos(this_00,(int)dVar7,CursorBetweenCharacters);
LAB_003ecf46:
    iVar5 = iVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
LAB_003ed052:
    ::QVariant::QVariant(__return_storage_ptr__,iVar5);
    break;
  default:
    if (property == ImSurroundingText) {
      QWidgetLineControl::surroundingText
                ((QString *)&local_38,(QWidgetLineControl *)this_00->control);
LAB_003ed0ba:
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
LAB_003ed139:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
    }
    else {
      if (property == ImCurrentSelection) {
        selectedText((QString *)&local_38,this);
        goto LAB_003ed0ba;
      }
      if (property == ImMaximumTextLength) {
        iVar5 = this_00->control->m_maxLength;
LAB_003ed03b:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
        goto LAB_003ed052;
      }
      if (property == ImAnchorPosition) {
        pQVar3 = this_00->control;
        bVar6 = (pQVar3->m_text).d.size == 0;
        iVar1 = pQVar3->m_selend;
        iVar2 = pQVar3->m_selstart;
        iVar5 = iVar2;
        if (bVar6 || iVar1 <= iVar2) {
          iVar5 = -1;
        }
        iVar4 = -1;
        if (!bVar6 && iVar2 < iVar1) {
          iVar4 = iVar1;
        }
        if (iVar5 == iVar4) {
          iVar5 = pQVar3->m_cursor;
          if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
          goto LAB_003ed052;
        }
        if (iVar5 == pQVar3->m_cursor) goto LAB_003ecf46;
        goto LAB_003ed03b;
      }
      if (property == ImAbsolutePosition) goto switchD_003ece63_caseD_8;
      if (property == ImTextBeforeCursor) {
        dVar7 = (double)::QVariant::toPointF();
        if ((((dVar7 != 0.0) || (NAN(dVar7))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
          iVar5 = QLineEditPrivate::xToPos(this_00,(int)dVar7,CursorBetweenCharacters);
        }
        else {
          iVar5 = this_00->control->m_cursor;
        }
        QLineEditPrivate::textBeforeCursor((QString *)&local_38,this_00,iVar5);
LAB_003ed12b:
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
        goto LAB_003ed139;
      }
      if (property == ImTextAfterCursor) {
        dVar7 = (double)::QVariant::toPointF();
        if (((dVar7 != 0.0) || (NAN(dVar7))) || ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
          iVar5 = QLineEditPrivate::xToPos(this_00,(int)dVar7,CursorBetweenCharacters);
        }
        else {
          iVar5 = this_00->control->m_cursor;
        }
        QLineEditPrivate::textAfterCursor((QString *)&local_38,this_00,iVar5);
        goto LAB_003ed12b;
      }
      if (property != ImAnchorRectangle) {
        if (property != ImReadOnly) goto switchD_003ece63_caseD_3;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003ed168;
        bVar6 = SUB41((*(ushort *)&this_00->control->field_0x50 & 4) >> 2,0);
        goto LAB_003ed0e0;
      }
      local_38 = QWidgetLineControl::anchorRect((QWidgetLineControl *)this_00->control);
      QVar8 = QLineEditPrivate::adjustedControlRect(this_00,&local_38);
      ::QVariant::QVariant(__return_storage_ptr__,QVar8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_003ed168:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QLineEdit::inputMethodQuery(Qt::InputMethodQuery property, QVariant argument) const
{
    Q_D(const QLineEdit);
    switch(property) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImCursorRectangle:
        return d->cursorRect();
    case Qt::ImAnchorRectangle:
        return d->adjustedControlRect(d->control->anchorRect());
    case Qt::ImFont:
        return font();
    case Qt::ImAbsolutePosition:
    case Qt::ImCursorPosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        return QVariant(d->control->cursor()); }
    case Qt::ImSurroundingText:
        return QVariant(d->control->surroundingText());
    case Qt::ImCurrentSelection:
        return QVariant(selectedText());
    case Qt::ImMaximumTextLength:
        return QVariant(maxLength());
    case Qt::ImAnchorPosition:
        if (d->control->selectionStart() == d->control->selectionEnd())
            return QVariant(d->control->cursor());
        else if (d->control->selectionStart() == d->control->cursor())
            return QVariant(d->control->selectionEnd());
        else
            return QVariant(d->control->selectionStart());
    case Qt::ImReadOnly:
        return isReadOnly();
    case Qt::ImTextBeforeCursor: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return d->textBeforeCursor(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        else
            return d->textBeforeCursor(d->control->cursor()); }
    case Qt::ImTextAfterCursor: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return d->textAfterCursor(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        else
            return d->textAfterCursor(d->control->cursor()); }
    default:
        return QWidget::inputMethodQuery(property);
    }
}